

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::AssignStmt::clear(AssignStmt *this)

{
  Var *pVVar1;
  shared_ptr<kratos::AssignStmt> sVar2;
  shared_ptr<kratos::Stmt> local_60;
  undefined1 local_50 [32];
  shared_ptr<kratos::Stmt> local_30;
  undefined8 local_10;
  AssignStmt *this_local;
  
  pVVar1 = this->left_;
  local_10 = this;
  std::enable_shared_from_this<kratos::Stmt>::shared_from_this
            ((enable_shared_from_this<kratos::Stmt> *)&local_30);
  std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_30);
  sVar2 = Stmt::as<kratos::AssignStmt>((Stmt *)&stack0xffffffffffffffe0);
  (*(pVVar1->super_IRNode)._vptr_IRNode[0x13])
            (pVVar1,&stack0xffffffffffffffe0,
             sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&stack0xffffffffffffffe0);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_30);
  pVVar1 = this->right_;
  std::enable_shared_from_this<kratos::Stmt>::shared_from_this
            ((enable_shared_from_this<kratos::Stmt> *)&local_60);
  std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_60);
  sVar2 = Stmt::as<kratos::AssignStmt>((Stmt *)local_50);
  (*(pVVar1->super_IRNode)._vptr_IRNode[0xf])
            (pVVar1,local_50,
             sVar2.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_50);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_60);
  (this->super_Stmt).parent_ = (IRNode *)0x0;
  return;
}

Assistant:

void AssignStmt::clear() {
    // remove it from source and sinks
    left_->remove_source(shared_from_this()->as<AssignStmt>());
    right_->remove_sink(shared_from_this()->as<AssignStmt>());
    parent_ = nullptr;
}